

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
::find_or_prepare_insert_non_soo<std::vector<int,std::allocator<int>>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
          *this,vector<int,_std::allocator<int>_> *key)

{
  char *pcVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 uVar24;
  bool bVar25;
  ushort uVar26;
  uint64_t uVar27;
  ctrl_t *pcVar28;
  ulong uVar29;
  CommonFields *common;
  size_t sVar30;
  PolicyFunctions *in_R9;
  uint uVar31;
  ulong uVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i match;
  undefined1 auVar39 [16];
  FindInfo target;
  ulong local_78;
  char cVar33;
  char cVar36;
  char cVar37;
  char cVar38;
  
  piVar2 = (key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar27 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,piVar2,
                      (long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar29 = ((long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 ^ uVar27) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 | (uVar29 & 0xff0000000000) >> 0x18
            | (uVar29 & 0xff00000000) >> 8 | (uVar29 & 0xff000000) << 8 |
            (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
  uVar4 = *(ulong *)(this + 0x10);
  uVar32 = (ulong)common >> 7 ^ uVar4 >> 0xc;
  uVar24 = (undefined1)(uVar29 >> 0x38);
  auVar34 = ZEXT216(CONCAT11(uVar24,uVar24) & 0x7f7f);
  auVar34 = pshuflw(auVar34,auVar34,0);
  local_78 = 0;
  do {
    uVar32 = uVar32 & uVar3;
    pcVar1 = (char *)(uVar4 + uVar32);
    cVar8 = *pcVar1;
    cVar9 = pcVar1[1];
    cVar10 = pcVar1[2];
    cVar11 = pcVar1[3];
    cVar12 = pcVar1[4];
    cVar13 = pcVar1[5];
    cVar14 = pcVar1[6];
    cVar15 = pcVar1[7];
    cVar16 = pcVar1[8];
    cVar17 = pcVar1[9];
    cVar18 = pcVar1[10];
    cVar19 = pcVar1[0xb];
    cVar20 = pcVar1[0xc];
    cVar21 = pcVar1[0xd];
    cVar22 = pcVar1[0xe];
    cVar23 = pcVar1[0xf];
    cVar33 = auVar34[0];
    auVar35[0] = -(cVar33 == cVar8);
    cVar36 = auVar34[1];
    auVar35[1] = -(cVar36 == cVar9);
    cVar37 = auVar34[2];
    auVar35[2] = -(cVar37 == cVar10);
    cVar38 = auVar34[3];
    auVar35[3] = -(cVar38 == cVar11);
    auVar35[4] = -(cVar33 == cVar12);
    auVar35[5] = -(cVar36 == cVar13);
    auVar35[6] = -(cVar37 == cVar14);
    auVar35[7] = -(cVar38 == cVar15);
    auVar35[8] = -(cVar33 == cVar16);
    auVar35[9] = -(cVar36 == cVar17);
    auVar35[10] = -(cVar37 == cVar18);
    auVar35[0xb] = -(cVar38 == cVar19);
    auVar35[0xc] = -(cVar33 == cVar20);
    auVar35[0xd] = -(cVar36 == cVar21);
    auVar35[0xe] = -(cVar37 == cVar22);
    auVar35[0xf] = -(cVar38 == cVar23);
    uVar26 = (ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe | (ushort)(auVar35[0xf] >> 7) << 0xf;
    uVar31 = (uint)uVar26;
    while (uVar26 != 0) {
      uVar6 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      sVar30 = uVar6 + uVar32 & uVar3;
      bVar25 = std::equal_to<std::vector<int,_std::allocator<int>_>_>::operator()
                         ((equal_to<std::vector<int,_std::allocator<int>_>_> *)this,
                          (vector<int,_std::allocator<int>_> *)
                          (sVar30 * 0x30 + *(long *)(this + 0x18)),key);
      if (bVar25) {
        if (*(long *)(this + 0x10) == 0) goto LAB_00f192ae;
        pcVar28 = (ctrl_t *)(*(long *)(this + 0x10) + sVar30);
        bVar25 = false;
        goto LAB_00f1925c;
      }
      uVar26 = (ushort)(uVar31 - 1) & (ushort)uVar31;
      uVar31 = CONCAT22((short)(uVar31 - 1 >> 0x10),uVar26);
    }
    auVar39[0] = -(cVar8 == -0x80);
    auVar39[1] = -(cVar9 == -0x80);
    auVar39[2] = -(cVar10 == -0x80);
    auVar39[3] = -(cVar11 == -0x80);
    auVar39[4] = -(cVar12 == -0x80);
    auVar39[5] = -(cVar13 == -0x80);
    auVar39[6] = -(cVar14 == -0x80);
    auVar39[7] = -(cVar15 == -0x80);
    auVar39[8] = -(cVar16 == -0x80);
    auVar39[9] = -(cVar17 == -0x80);
    auVar39[10] = -(cVar18 == -0x80);
    auVar39[0xb] = -(cVar19 == -0x80);
    auVar39[0xc] = -(cVar20 == -0x80);
    auVar39[0xd] = -(cVar21 == -0x80);
    auVar39[0xe] = -(cVar22 == -0x80);
    auVar39[0xf] = -(cVar23 == -0x80);
    uVar26 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe | (ushort)(auVar39[0xf] >> 7) << 0xf;
    if (uVar26 != 0) {
      bVar25 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar25) {
        uVar7 = 0xf;
        if (uVar26 != 0) {
          for (; uVar26 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar31 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar31 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_78;
      sVar30 = PrepareInsertNonSoo((container_internal *)this,common,uVar31 + uVar32 & uVar3,target,
                                   in_R9);
      if (*(long *)(this + 0x10) == 0) {
LAB_00f192ae:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, std::vector<int>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, std::vector<int>>>]"
                     );
      }
      pcVar28 = (ctrl_t *)(*(long *)(this + 0x10) + sVar30);
      bVar25 = true;
LAB_00f1925c:
      lVar5 = *(long *)(this + 0x18);
      (__return_storage_ptr__->first).ctrl_ = pcVar28;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(sVar30 * 0x30 + lVar5);
      __return_storage_ptr__->second = bVar25;
      return __return_storage_ptr__;
    }
    uVar32 = uVar32 + local_78 + 0x10;
    local_78 = local_78 + 0x10;
    if (*(ulong *)this < local_78) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, std::vector<int>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, std::vector<int>>>, K = std::vector<int>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }